

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  _Manager_type p_Var1;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Impl_00174590;
  p_Var1 = (this->render_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->render_,(_Any_data *)&this->render_,__destroy_functor);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  operator_delete(this,0x48);
  return;
}

Assistant:

Component Renderer(std::function<Element()> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element()> render) : render_(std::move(render)) {}
    Element Render() override { return render_(); }
    std::function<Element()> render_;
  };

  return Make<Impl>(std::move(render));
}